

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O0

int ConvertStringToInt08(char *szString,PDWORD PtrValue)

{
  int iVar1;
  byte local_1a;
  byte local_19;
  BYTE DigitTwo;
  BYTE DigitOne;
  PDWORD PtrValue_local;
  char *szString_local;
  
  local_19 = AsciiToUpperTable_BkSlash[*szString] - 0x30;
  local_1a = AsciiToUpperTable_BkSlash[szString[1]] - 0x30;
  if (9 < local_19) {
    local_19 = AsciiToUpperTable_BkSlash[*szString] - 0x37;
  }
  if (9 < local_1a) {
    local_1a = AsciiToUpperTable_BkSlash[szString[1]] - 0x37;
  }
  *PtrValue = (uint)local_19 << 4 | (uint)local_1a;
  iVar1 = 1000;
  if (local_19 < 0x10 && local_1a < 0x10) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int ConvertStringToInt08(const char * szString, PDWORD PtrValue)
{
    BYTE DigitOne = AsciiToUpperTable_BkSlash[szString[0]] - '0';
    BYTE DigitTwo = AsciiToUpperTable_BkSlash[szString[1]] - '0';

    // Fix the digits
    if(DigitOne > 9)
        DigitOne -= 'A' - '9' - 1;
    if(DigitTwo > 9)
        DigitTwo -= 'A' - '9' - 1;

    // Combine them into a value
    PtrValue[0] = (DigitOne << 0x04) | DigitTwo;
    return (DigitOne <= 0x0F && DigitTwo <= 0x0F) ? ERROR_SUCCESS : ERROR_BAD_FORMAT;
}